

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamRandomAccessController_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamRandomAccessController::~BamRandomAccessController
          (BamRandomAccessController *this)

{
  BamRandomAccessController *in_RDI;
  
  Close(in_RDI);
  std::__cxx11::string::~string((string *)&in_RDI->m_errorString);
  return;
}

Assistant:

BamRandomAccessController::~BamRandomAccessController(void) {
    Close();
}